

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler>&,char>>
                 (char *begin,char *end,
                 id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
                 *handler)

{
  byte bVar1;
  uint id;
  byte *pbVar2;
  byte *local_20;
  
  bVar1 = *begin;
  local_20 = (byte *)begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
    ::operator()(handler);
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    id = parse_nonnegative_int<char,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler>&,char>&>
                   ((char **)&local_20,end,handler);
    if ((local_20 == (byte *)end) || ((*local_20 != 0x3a && (*local_20 != 0x7d)))) {
      id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
      ::on_error(handler,"invalid format string");
      begin = (char *)local_20;
    }
    else {
      id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
      ::operator()(handler,id);
      begin = (char *)local_20;
    }
  }
  else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    pbVar2 = (byte *)(begin + 1);
    do {
      begin = (char *)pbVar2;
      if (begin == end) {
        return end;
      }
      bVar1 = *begin;
      pbVar2 = (byte *)begin + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
  }
  else {
    id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
    ::on_error(handler,"invalid format string");
  }
  return (char *)(byte *)begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}